

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O2

void __thiscall
sisl::cartesian_cubic<short>::each_site
          (cartesian_cubic<short> *this,
          function<void_(const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_&)> *func,bool parallel)

{
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *this_00;
  lattice_site site;
  uint local_6c;
  uint local_68;
  uint local_64;
  Matrix<int,__1,_1,_0,__1,_1> local_60;
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> local_50;
  
  for (local_64 = 0; local_64 <= this->_nx; local_64 = local_64 + 1) {
    for (local_68 = 0; local_68 <= this->_ny; local_68 = local_68 + 1) {
      for (local_6c = 0; local_6c <= this->_nz; local_6c = local_6c + 1) {
        local_50.m_xpr._0_4_ = 3;
        Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_60,(int *)&local_50);
        Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::CommaInitializer
                  (&local_50,&local_60,(Scalar *)&local_64);
        this_00 = Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_
                            (&local_50,(Scalar *)&local_68);
        Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_
                  (this_00,(Scalar *)&local_6c);
        Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::finished(&local_50);
        std::function<void_(const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_&)>::operator()
                  (func,&local_60);
        free(local_60.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      }
    }
  }
  return;
}

Assistant:

virtual void each_site(const std::function<void(const lattice_site &)> &func, bool parallel = false) {
            #pragma omp parallel for if(parallel)
            for(int i = 0; i <= _nx; i++) {
                for(int j = 0; j <= _ny; j++) {
                    for(int k = 0; k <= _nz; k++) {
                        lattice_site site(3);
                        site << i, j, k;
                        func(site);
                    }
                }
            }
        }